

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ClassType::handleExtends
          (ClassType *this,ExtendsClauseSyntax *extendsClause,ASTContext *context,
          function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  bool bVar1;
  byte bVar2;
  SymbolKind SVar3;
  Compilation *this_00;
  NameSyntax *className;
  ClassType *pCVar4;
  Diagnostic *pDVar5;
  Type *pTVar6;
  ClassType *pCVar7;
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  *this_01;
  SubroutineSymbol *pSVar8;
  MethodPrototypeSymbol *pMVar9;
  iterator iVar10;
  TransparentMemberSymbol *pTVar11;
  Symbol *pSVar12;
  Scope *scope;
  SubroutineSymbol *pSVar13;
  ConstraintBlockSymbol *pCVar14;
  DiagCode code;
  iterator iVar15;
  SourceRange SVar16;
  iterator_range<slang::ast::Scope::iterator> iVar17;
  MethodPrototypeSymbol *local_70;
  iterator __begin2;
  
  this_00 = ASTContext::getCompilation(context);
  className = not_null<slang::syntax::NameSyntax_*>::get(&extendsClause->baseName);
  pCVar4 = Lookup::findClass(className,context,(optional<slang::DiagCode>)0x0);
  if (pCVar4 != (ClassType *)0x0) {
    pCVar7 = pCVar4;
    if (pCVar4->isInterface != false) {
      this->baseClass = this_00->errorType;
      SVar16 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
      pDVar5 = ASTContext::addDiag(context,(DiagCode)0x240006,SVar16);
      Diagnostic::operator<<(pDVar5,(pCVar4->super_Type).super_Symbol.name);
      return;
    }
    while (pCVar7 != this) {
      pTVar6 = getBaseClass(pCVar7);
      if ((pTVar6 == (Type *)0x0) || (bVar1 = Type::isError(pTVar6), bVar1)) {
        this->baseClass = &pCVar4->super_Type;
        this_01 = &Scope::getNameMap(&this->super_Scope)->
                   super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
        ;
        iVar17 = Scope::members(&pCVar4->super_Scope);
        __begin2 = iVar17.m_begin.current;
        bVar1 = false;
        goto LAB_0032b3eb;
      }
      pTVar6 = Type::getCanonicalType(pTVar6);
      pCVar7 = Symbol::as<slang::ast::ClassType>(&pTVar6->super_Symbol);
    }
    SVar16 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
    pDVar5 = ASTContext::addDiag(context,(DiagCode)0x20009,SVar16);
    Diagnostic::operator<<(pDVar5,(this->super_Type).super_Symbol.name);
  }
  this->baseClass = this_00->errorType;
  return;
LAB_0032b3eb:
  iVar15.current = __begin2.current;
  if (__begin2.current == iVar17.m_end.current.current) {
    iVar17 = Scope::members(&this->super_Scope);
    __begin2 = iVar17.m_begin.current;
    do {
      iVar15.current = __begin2.current;
      if (__begin2.current == iVar17.m_end.current.current) {
        return;
      }
      SVar3 = (__begin2.current)->kind;
      if (SVar3 == Subroutine) {
        pSVar8 = Symbol::as<slang::ast::SubroutineSymbol>(__begin2.current);
        pCVar7 = pCVar4;
        if (((pSVar8->flags).m_bits & 0xc) == 0) {
          while (pSVar12 = Scope::find(&pCVar7->super_Scope,(pSVar8->super_Symbol).name),
                pSVar12 == (Symbol *)0x0) {
            pTVar6 = getBaseClass(pCVar7);
            if ((pTVar6 == (Type *)0x0) || (bVar1 = Type::isError(pTVar6), bVar1))
            goto LAB_0032b82f;
            pTVar6 = Type::getCanonicalType(pTVar6);
            pCVar7 = Symbol::as<slang::ast::ClassType>(&pTVar6->super_Symbol);
          }
          if ((pSVar12->kind == Subroutine) &&
             ((pSVar13 = Symbol::as<slang::ast::SubroutineSymbol>(pSVar12),
              ((pSVar13->flags).m_bits & 1) != 0 || (pSVar13->overrides != (SubroutineSymbol *)0x0))
             )) {
            SubroutineSymbol::setOverride(pSVar8,pSVar13);
          }
        }
      }
      else if (SVar3 == MethodPrototype) {
        pMVar9 = Symbol::as<slang::ast::MethodPrototypeSymbol>(__begin2.current);
        pCVar7 = pCVar4;
        if (((pMVar9->flags).m_bits & 0xc) == 0) {
          while (pSVar12 = Scope::find(&pCVar7->super_Scope,(pMVar9->super_Symbol).name),
                pSVar12 == (Symbol *)0x0) {
            pTVar6 = getBaseClass(pCVar7);
            if ((pTVar6 == (Type *)0x0) || (bVar1 = Type::isError(pTVar6), bVar1))
            goto LAB_0032b663;
            pTVar6 = Type::getCanonicalType(pTVar6);
            pCVar7 = Symbol::as<slang::ast::ClassType>(&pTVar6->super_Symbol);
          }
          if ((pSVar12->kind == Subroutine) &&
             ((pSVar8 = Symbol::as<slang::ast::SubroutineSymbol>(pSVar12),
              ((pSVar8->flags).m_bits & 1) != 0 || (pSVar8->overrides != (SubroutineSymbol *)0x0))))
          {
            pMVar9->overrides = &pSVar8->super_Symbol;
          }
        }
LAB_0032b663:
        pSVar12 = pMVar9->overrides;
        if ((pSVar12 != (Symbol *)0x0) &&
           (pSVar8 = MethodPrototypeSymbol::getSubroutine(pMVar9), pSVar8 != (SubroutineSymbol *)0x0
           )) {
          scope = not_null<const_slang::ast::Scope_*>::get(&context->scope);
          pSVar13 = Symbol::as<slang::ast::SubroutineSymbol>(pSVar12);
          SubroutineSymbol::checkVirtualMethodMatch(scope,pSVar13,pSVar8,true);
        }
      }
      else {
        pCVar7 = pCVar4;
        if (SVar3 == ConstraintBlock) {
          while (pSVar12 = Scope::find(&pCVar7->super_Scope,(iVar15.current)->name),
                pSVar12 == (Symbol *)0x0) {
            pTVar6 = getBaseClass(pCVar7);
            if ((pTVar6 == (Type *)0x0) || (bVar1 = Type::isError(pTVar6), bVar1))
            goto LAB_0032b82f;
            pTVar6 = Type::getCanonicalType(pTVar6);
            pCVar7 = Symbol::as<slang::ast::ClassType>(&pTVar6->super_Symbol);
          }
          if (((pSVar12->kind == ConstraintBlock) &&
              (pCVar14 = Symbol::as<slang::ast::ConstraintBlockSymbol>(pSVar12),
              pCVar14->isPure == true)) &&
             (bVar1 = pCVar14->isStatic,
             pCVar14 = Symbol::as<slang::ast::ConstraintBlockSymbol>(iVar15.current),
             bVar1 != pCVar14->isStatic)) {
            pDVar5 = ASTContext::addDiag(context,(DiagCode)0x5c0006,(iVar15.current)->location);
            Diagnostic::addNote(pDVar5,(DiagCode)0x40001,pSVar12->location);
          }
        }
      }
LAB_0032b82f:
      Scope::iterator::operator++(&__begin2);
    } while( true );
  }
  if (((__begin2.current)->name)._M_len != 0) {
    SVar3 = (__begin2.current)->kind;
    if (SVar3 == Subroutine) {
      pSVar8 = Symbol::as<slang::ast::SubroutineSymbol>(__begin2.current);
      if (((pSVar8->flags).m_bits & 8) != 0) {
        this->baseConstructor = iVar15.current;
        goto LAB_0032b522;
      }
      SVar3 = (iVar15.current)->kind;
    }
    if ((SVar3 == MethodPrototype) &&
       (pMVar9 = Symbol::as<slang::ast::MethodPrototypeSymbol>(iVar15.current),
       ((pMVar9->flags).m_bits & 8) != 0)) {
      pMVar9 = Symbol::as<slang::ast::MethodPrototypeSymbol>(iVar15.current);
      pSVar8 = MethodPrototypeSymbol::getSubroutine(pMVar9);
      this->baseConstructor = &pSVar8->super_Symbol;
    }
    else {
      iVar10 = ska::detailv3::
               sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
               ::find(this_01,&(iVar15.current)->name);
      if (iVar10.current ==
          this_01->entries + this_01->num_slots_minus_one + (long)this_01->max_lookups) {
        if ((iVar15.current)->kind == TransparentMember) {
          pTVar11 = Symbol::as<slang::ast::TransparentMemberSymbol>(iVar15.current);
          iVar15.current = pTVar11->wrapped;
        }
        bVar2 = this->isAbstract;
        if (((bool)bVar2 == false) && ((iVar15.current)->kind == MethodPrototype)) {
          local_70 = Symbol::as<slang::ast::MethodPrototypeSymbol>(iVar15.current);
          if (((local_70->flags).m_bits & 2) == 0) {
            bVar2 = this->isAbstract;
            goto LAB_0032b4a9;
          }
          if (bVar1) goto LAB_0032b522;
          SVar16 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
          code.subsystem = Declarations;
          code.code = 0x35;
LAB_0032b557:
          pDVar5 = ASTContext::addDiag(context,code,SVar16);
          Diagnostic::operator<<(pDVar5,(this->super_Type).super_Symbol.name);
          Diagnostic::operator<<(pDVar5,(pCVar4->super_Type).super_Symbol.name);
          Diagnostic::operator<<(pDVar5,(local_70->super_Symbol).name);
          Diagnostic::addNote(pDVar5,(DiagCode)0x40001,(local_70->super_Symbol).location);
          bVar1 = true;
        }
        else {
LAB_0032b4a9:
          if ((((bVar2 & 1) == 0) && ((iVar15.current)->kind == ConstraintBlock)) &&
             (local_70 = (MethodPrototypeSymbol *)
                         Symbol::as<slang::ast::ConstraintBlockSymbol>(iVar15.current),
             *(char *)((long)&(local_70->declaredReturnType).type + 3) == '\x01')) {
            if (!bVar1) {
              SVar16 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
              code.subsystem = Declarations;
              code.code = 0x36;
              goto LAB_0032b557;
            }
          }
          else {
            pTVar11 = BumpAllocator::
                      emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                                (&this_00->super_BumpAllocator,iVar15.current);
            (*insertCB.callback)(insertCB.callable,&pTVar11->super_Symbol);
          }
        }
      }
    }
  }
LAB_0032b522:
  Scope::iterator::operator++(&__begin2);
  goto LAB_0032b3eb;
}

Assistant:

void ClassType::handleExtends(const ExtendsClauseSyntax& extendsClause, const ASTContext& context,
                              function_ref<void(const Symbol&)> insertCB) const {
    auto& comp = context.getCompilation();
    auto baseType = Lookup::findClass(*extendsClause.baseName, context);
    if (!baseType) {
        baseClass = &comp.getErrorType();
        return;
    }

    // A normal class can't extend an interface class. This method won't be called
    // for an interface class, so we don't need to check that again here.
    if (baseType->isInterface) {
        baseClass = &comp.getErrorType();
        context.addDiag(diag::ExtendIfaceFromClass, extendsClause.sourceRange()) << baseType->name;
        return;
    }

    // Make sure there are no cycles in the inheritance chain.
    auto currBase = baseType;
    while (true) {
        if (currBase == this) {
            context.addDiag(diag::ClassInheritanceCycle, extendsClause.sourceRange()) << name;
            baseClass = &comp.getErrorType();
            return;
        }

        auto next = currBase->getBaseClass();
        if (!next || next->isError())
            break;

        currBase = &next->getCanonicalType().as<ClassType>();
    }

    // Assign this member before resolving anything below, because they
    // may try to check the base class of this type.
    baseClass = baseType;

    // Inherit all base class members that don't conflict with our declared symbols.
    auto& scopeNameMap = getNameMap();
    bool pureVirtualError = false;

    for (auto& member : baseType->members()) {
        if (member.name.empty())
            continue;

        // Don't inherit constructors.
        if (member.kind == SymbolKind::Subroutine &&
            member.as<SubroutineSymbol>().flags.has(MethodFlags::Constructor)) {
            baseConstructor = &member;
            continue;
        }
        if (member.kind == SymbolKind::MethodPrototype &&
            member.as<MethodPrototypeSymbol>().flags.has(MethodFlags::Constructor)) {
            baseConstructor = member.as<MethodPrototypeSymbol>().getSubroutine();
            continue;
        }

        // Don't inherit if the member is already overridden.
        if (auto it = scopeNameMap.find(member.name); it != scopeNameMap.end())
            continue;

        // If the symbol itself was already inherited, create a new wrapper around
        // it for our own scope.
        const Symbol* toWrap = &member;
        if (member.kind == SymbolKind::TransparentMember)
            toWrap = &member.as<TransparentMemberSymbol>().wrapped;

        // If this is a pure virtual method being inherited and we aren't ourselves
        // an abstract class, issue an error.
        if (!isAbstract && toWrap->kind == SymbolKind::MethodPrototype) {
            auto& sub = toWrap->as<MethodPrototypeSymbol>();
            if (sub.flags & MethodFlags::Pure) {
                if (!pureVirtualError) {
                    auto& diag = context.addDiag(diag::InheritFromAbstract,
                                                 extendsClause.sourceRange());
                    diag << name;
                    diag << baseType->name;
                    diag << sub.name;
                    diag.addNote(diag::NoteDeclarationHere, sub.location);
                    pureVirtualError = true;
                }
                continue;
            }
        }

        if (!isAbstract && toWrap->kind == SymbolKind::ConstraintBlock) {
            auto& cb = toWrap->as<ConstraintBlockSymbol>();
            if (cb.isPure) {
                if (!pureVirtualError) {
                    auto& diag = context.addDiag(diag::InheritFromAbstractConstraint,
                                                 extendsClause.sourceRange());
                    diag << name;
                    diag << baseType->name;
                    diag << cb.name;
                    diag.addNote(diag::NoteDeclarationHere, cb.location);
                    pureVirtualError = true;
                }
                continue;
            }
        }

        // All symbols get inserted into the beginning of the scope using the
        // provided insertion callback. We insert them as TransparentMemberSymbols
        // so that we can trace a path back to the actual location they are declared.
        auto wrapper = comp.emplace<TransparentMemberSymbol>(*toWrap);
        insertCB(*wrapper);
    }

    auto checkForOverride = [&](auto& member) {
        // Constructors and static methods can never be virtual.
        if (member.flags.has(MethodFlags::Constructor | MethodFlags::Static))
            return;

        // Look in the parent class for a method with the same name.
        auto currentBase = baseType;
        while (true) {
            const Symbol* found = currentBase->find(member.name);
            if (found) {
                if (found->kind == SymbolKind::Subroutine) {
                    auto& baseSub = found->as<SubroutineSymbol>();
                    if (baseSub.isVirtual())
                        member.setOverride(baseSub);
                }
                break;
            }

            // Otherwise it could be inherited from a higher-level base.
            auto possibleBase = currentBase->getBaseClass();
            if (!possibleBase || possibleBase->isError())
                break;

            currentBase = &possibleBase->getCanonicalType().as<ClassType>();
        }
    };

    // Check all methods in our class for overriding virtual methods in parent classes.
    for (auto& member : members()) {
        if (member.kind == SymbolKind::Subroutine)
            checkForOverride(member.as<SubroutineSymbol>());
        else if (member.kind == SymbolKind::MethodPrototype) {
            auto& proto = member.as<MethodPrototypeSymbol>();
            checkForOverride(proto);

            if (auto baseSub = proto.getOverride()) {
                if (auto protoSub = proto.getSubroutine()) {
                    SubroutineSymbol::checkVirtualMethodMatch(*context.scope,
                                                              baseSub->as<SubroutineSymbol>(),
                                                              *protoSub,
                                                              /* allowDerivedReturn */ true);
                }
            }
        }
        else if (member.kind == SymbolKind::ConstraintBlock) {
            // Constraint blocks can also be overridden -- check that 'static'ness
            // matches between base and derived if the base is pure.
            auto currentBase = baseType;
            while (true) {
                const Symbol* found = currentBase->find(member.name);
                if (found) {
                    if (found->kind == SymbolKind::ConstraintBlock) {
                        auto& baseConstraint = found->as<ConstraintBlockSymbol>();
                        if (baseConstraint.isPure &&
                            baseConstraint.isStatic !=
                                member.as<ConstraintBlockSymbol>().isStatic) {
                            auto& diag = context.addDiag(diag::MismatchStaticConstraint,
                                                         member.location);
                            diag.addNote(diag::NoteDeclarationHere, found->location);
                        }
                    }
                    break;
                }

                // Otherwise it could be inherited from a higher-level base.
                auto possibleBase = currentBase->getBaseClass();
                if (!possibleBase || possibleBase->isError())
                    break;

                currentBase = &possibleBase->getCanonicalType().as<ClassType>();
            }
        }
    }
}